

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O0

vector<int,_std::allocator<int>_> *
read_numbered_sentence(string *line,Dict *sd,vector<int,_std::allocator<int>_> *identifiers)

{
  undefined1 uVar1;
  bool bVar2;
  __type _Var3;
  byte bVar4;
  int iVar5;
  istream *piVar6;
  char *__nptr;
  ulong uVar7;
  vector<int,_std::allocator<int>_> *in_RCX;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string sep;
  string word;
  istringstream in;
  vector<int,_std::allocator<int>_> *res;
  undefined4 in_stack_fffffffffffffdb8;
  undefined2 in_stack_fffffffffffffdbc;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdd8;
  allocator local_1e9;
  string local_1e8 [8];
  string *in_stack_fffffffffffffe20;
  Dict *in_stack_fffffffffffffe28;
  string local_1c0 [32];
  long local_1a0 [48];
  vector<int,_std::allocator<int>_> *local_20;
  
  local_20 = in_RCX;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1a0,in_RSI,_S_in);
  std::__cxx11::string::string(local_1c0);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x169b5d);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,"|||",&local_1e9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  uVar1 = std::ios::operator_cast_to_bool
                    ((ios *)((long)local_1a0 + *(long *)(local_1a0[0] + -0x18)));
  if ((bool)uVar1) {
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x169bc7);
    while( true ) {
      piVar6 = std::operator>>((istream *)local_1a0,local_1c0);
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
      if ((((!bVar2) ||
           (bVar4 = std::ios::operator!((ios *)((long)local_1a0 + *(long *)(local_1a0[0] + -0x18))),
           (bVar4 & 1) != 0)) || (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) != 0)) ||
         (_Var3 = std::operator==(in_RDI,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT17(uVar1,in_stack_fffffffffffffdd8)), _Var3))
      break;
      in_stack_fffffffffffffdc0 = local_20;
      __nptr = (char *)std::__cxx11::string::c_str();
      atoi(__nptr);
      std::vector<int,_std::allocator<int>_>::push_back
                (in_stack_fffffffffffffdc0,
                 (value_type_conflict *)
                 CONCAT17(in_stack_fffffffffffffdbf,
                          CONCAT16(in_stack_fffffffffffffdbe,
                                   CONCAT24(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8))));
    }
  }
  while (uVar1 = std::ios::operator_cast_to_bool
                           ((ios *)((long)local_1a0 + *(long *)(local_1a0[0] + -0x18))), (bool)uVar1
        ) {
    std::operator>>((istream *)local_1a0,local_1c0);
    bVar4 = std::ios::operator!((ios *)((long)local_1a0 + *(long *)(local_1a0[0] + -0x18)));
    if (((bVar4 & 1) != 0) || (uVar7 = std::__cxx11::string::empty(), (uVar7 & 1) != 0)) break;
    iVar5 = dynet::Dict::convert(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_fffffffffffffdc0,
               (value_type_conflict *)
               CONCAT17(uVar1,CONCAT16(bVar4,CONCAT24(in_stack_fffffffffffffdbc,iVar5))));
  }
  std::__cxx11::string::~string(local_1e8);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::istringstream::~istringstream((istringstream *)local_1a0);
  return (vector<int,_std::allocator<int>_> *)in_RDI;
}

Assistant:

std::vector<int> read_numbered_sentence(const std::string& line, Dict* sd, vector<int> &identifiers) {
    std::istringstream in(line);
    std::string word;
    std::vector<int> res;
    std::string sep = "|||";
    if (in) {
        identifiers.clear();
        while (in >> word) {
            if (!in || word.empty()) break;
            if (word == sep) break;
            identifiers.push_back(atoi(word.c_str()));
        }
    }

    while(in) {
        in >> word;
        if (!in || word.empty()) break;
        res.push_back(sd->convert(word));
    }
    return res;
}